

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferMAXSizeValidation.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TextureBufferMAXSizeValidation::iterate(TextureBufferMAXSizeValidation *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  int local_4dc;
  MessageBuilder local_4d8;
  uint local_354;
  uint *puStack_350;
  GLuint expectedValue;
  GLuint *result;
  undefined1 local_340 [4];
  GLint location;
  int local_1bc;
  int local_1b8;
  GLint expectedSize;
  GLint textureSize;
  MessageBuilder local_1a8;
  int local_24;
  int local_20;
  int expectedOffset;
  GLint textureOffset;
  bool testResult;
  Functions *gl;
  TextureBufferMAXSizeValidation *this_local;
  
  gl = (Functions *)this;
  initTest(this);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _textureOffset = CONCAT44(extraout_var,iVar1);
  expectedOffset._3_1_ = 1;
  local_20 = -1;
  (**(code **)(_textureOffset + 0xab0))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0,
             (this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER_OFFSET,&local_20);
  dVar2 = (**(code **)(_textureOffset + 0x800))();
  glu::checkError(dVar2,"Error getting texture buffer offset parameter value!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xbd);
  local_24 = 0;
  if (local_20 != 0) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_1a8,
                        (char (*) [57])"Expected GL_TEXTURE_BUFFER_OFFSET_EXT parameter value : ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_24);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [57])
                               "Result   GL_TEXTURE_BUFFER_OFFSET_EXT parameter value : ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_20);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    expectedOffset._3_1_ = 0;
  }
  local_1b8 = 0;
  (**(code **)(_textureOffset + 0xab0))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0,
             (this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER_SIZE,&local_1b8);
  dVar2 = (**(code **)(_textureOffset + 0x800))();
  glu::checkError(dVar2,"Error getting texture buffer paramter value!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xce);
  local_1bc = this->m_max_tex_buffer_size;
  if (local_1bc != local_1b8) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_340,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_340,
                        (char (*) [55])"Expected GL_TEXTURE_BUFFER_SIZE_EXT parameter value : ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1bc);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [55])
                               "Result   GL_TEXTURE_BUFFER_SIZE_EXT parameter value : ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1b8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_340);
    expectedOffset._3_1_ = 0;
  }
  (**(code **)(_textureOffset + 0x1680))(this->m_po_id);
  dVar2 = (**(code **)(_textureOffset + 0x800))();
  glu::checkError(dVar2,"Error setting program!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xdd);
  (**(code **)(_textureOffset + 0x48))(0x90d2,0,this->m_ssbo_id);
  dVar2 = (**(code **)(_textureOffset + 0x800))();
  glu::checkError(dVar2,"Could not bind buffer object to shader storage binding point!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xe0);
  (**(code **)(_textureOffset + 8))(0x84c0);
  dVar2 = (**(code **)(_textureOffset + 0x800))();
  glu::checkError(dVar2,"Error activating texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xe3);
  (**(code **)(_textureOffset + 0xb8))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_tex_id);
  dVar2 = (**(code **)(_textureOffset + 0x800))();
  glu::checkError(dVar2,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xe6);
  result._4_4_ = (**(code **)(_textureOffset + 0xb48))(this->m_po_id,"sampler_buffer");
  dVar2 = (**(code **)(_textureOffset + 0x800))();
  glu::checkError(dVar2,"Error getting uniform location!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xe9);
  (**(code **)(_textureOffset + 0x14f0))(result._4_4_,0);
  dVar2 = (**(code **)(_textureOffset + 0x800))();
  glu::checkError(dVar2,"Error setting value for uniform location!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xec);
  (**(code **)(_textureOffset + 0x528))(1,1);
  dVar2 = (**(code **)(_textureOffset + 0x800))();
  glu::checkError(dVar2,"Error running compute shader!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xef);
  (**(code **)(_textureOffset + 0xdb8))(0x200);
  dVar2 = (**(code **)(_textureOffset + 0x800))();
  glu::checkError(dVar2,"Error setting memory barrier!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xf2);
  puStack_350 = (uint *)(**(code **)(_textureOffset + 0xd00))(0x90d2,0,0xc,1);
  dVar2 = (**(code **)(_textureOffset + 0x800))();
  glu::checkError(dVar2,"Error mapping buffer object to client\'s address space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferMAXSizeValidation.cpp"
                  ,0xf7);
  local_354 = (this->m_max_tex_buffer_size + -1) % 0x100;
  if (((*puStack_350 != this->m_max_tex_buffer_size) || (puStack_350[1] != 0)) ||
     (puStack_350[2] != local_354)) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4d8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_4d8,(char (*) [35])"Result is different than expected\n");
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [43])"Expected size:                            ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_max_tex_buffer_size);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [43])"Result value  (textureSize):              ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,puStack_350);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [43])"Expected Value (for index 0)              ");
    local_4dc = 0;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_4dc);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [43])"Result value                              ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,puStack_350 + 1);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [43])"ExpectedValue (for last index)            ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_354);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [43])"Result value                              ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,puStack_350 + 2);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4d8);
    expectedOffset._3_1_ = 0;
  }
  if ((expectedOffset._3_1_ & 1) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  (**(code **)(_textureOffset + 0x1670))(0x90d2);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureBufferMAXSizeValidation::iterate(void)
{
	initTest();

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool testResult = true;

	glw::GLint textureOffset = -1;

	gl.getTexLevelParameteriv(m_glExtTokens.TEXTURE_BUFFER, 0, m_glExtTokens.TEXTURE_BUFFER_OFFSET, &textureOffset);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting texture buffer offset parameter value!");

	/* Check if offset is equal to 0 */
	const int expectedOffset = 0;

	if (expectedOffset != textureOffset)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Expected GL_TEXTURE_BUFFER_OFFSET_EXT parameter value : " << expectedOffset << "\n"
						   << "Result   GL_TEXTURE_BUFFER_OFFSET_EXT parameter value : " << textureOffset << "\n"
						   << tcu::TestLog::EndMessage;
		testResult = false;
	}

	glw::GLint textureSize = 0;

	gl.getTexLevelParameteriv(m_glExtTokens.TEXTURE_BUFFER, 0, m_glExtTokens.TEXTURE_BUFFER_SIZE, &textureSize);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting texture buffer paramter value!");

	/* Check if texture size is equal to m_max_tex_buffer_size * sizeof(glw::GLubyte) */
	glw::GLint expectedSize = static_cast<glw::GLint>(m_max_tex_buffer_size * sizeof(glw::GLubyte));

	if (expectedSize != textureSize)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Expected GL_TEXTURE_BUFFER_SIZE_EXT parameter value : " << expectedSize << "\n"
						   << "Result   GL_TEXTURE_BUFFER_SIZE_EXT parameter value : " << textureSize << "\n"
						   << tcu::TestLog::EndMessage;
		testResult = false;
	}

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting program!");

	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_ssbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object to shader storage binding point!");

	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error activating texture unit!");

	gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, m_tbo_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	glw::GLint location = gl.getUniformLocation(m_po_id, "sampler_buffer");
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting uniform location!");

	gl.uniform1i(location, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting value for uniform location!");

	gl.dispatchCompute(1, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error running compute shader!");

	gl.memoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting memory barrier!");

	/* Get result data */
	glw::GLuint* result = (glw::GLuint*)gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0,
														  m_n_vec_components * sizeof(glw::GLuint), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object to client's address space!");

	glw::GLuint expectedValue = (m_max_tex_buffer_size - 1) % 256;
	/* Log error if expected values and result data are not equal */
	if (result[0] != (glw::GLuint)m_max_tex_buffer_size || result[1] != 0 || result[2] != expectedValue)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Result is different than expected\n"
						   << "Expected size:                            " << m_max_tex_buffer_size << "\n"
						   << "Result value  (textureSize):              " << result[0] << "\n"
						   << "Expected Value (for index 0)              " << 0 << "\n"
						   << "Result value                              " << result[1] << "\n"
						   << "ExpectedValue (for last index)            " << expectedValue << "\n"
						   << "Result value                              " << result[2] << "\n"
						   << tcu::TestLog::EndMessage;

		testResult = false;
	}

	if (testResult)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);

	return STOP;
}